

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_CreateLevelR(Vec_Wec_t *vFanouts,Vec_Int_t *vLevelsR,Vec_Str_t *vEmpty)

{
  int iVar1;
  Vec_Int_t *vArray;
  int i;
  
  if (vLevelsR->nSize == 0) {
    Vec_IntFill(vLevelsR,vFanouts->nSize,0);
    i = vFanouts->nSize;
    while (0 < i) {
      i = i + -1;
      vArray = Vec_WecEntry(vFanouts,i);
      iVar1 = Sfm_ObjAddsLevelArray(vEmpty,i);
      iVar1 = Sfm_ObjLevelNewR(vArray,vLevelsR,iVar1);
      Vec_IntWriteEntry(vLevelsR,i,iVar1);
    }
    return;
  }
  __assert_fail("Vec_IntSize(vLevelsR) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                ,0x96,"void Sfm_CreateLevelR(Vec_Wec_t *, Vec_Int_t *, Vec_Str_t *)");
}

Assistant:

void Sfm_CreateLevelR( Vec_Wec_t * vFanouts, Vec_Int_t * vLevelsR, Vec_Str_t * vEmpty )
{
    Vec_Int_t * vArray;
    int i;
    assert( Vec_IntSize(vLevelsR) == 0 );
    Vec_IntFill( vLevelsR, Vec_WecSize(vFanouts), 0 );
    Vec_WecForEachLevelReverse( vFanouts, vArray, i )
        Vec_IntWriteEntry( vLevelsR, i, Sfm_ObjLevelNewR(vArray, vLevelsR, Sfm_ObjAddsLevelArray(vEmpty, i)) );
}